

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.h
# Opt level: O0

void Logger::printLine<int,unsigned_long>(wchar_t *text,int *args,unsigned_long *args_1)

{
  wstring local_40 [8];
  wstring message;
  unsigned_long *args_local_1;
  int *args_local;
  wchar_t *text_local;
  
  formatString<int,unsigned_long>((wchar_t *)local_40,text,(unsigned_long *)args);
  printLine(local_40);
  std::__cxx11::wstring::~wstring((wstring *)local_40);
  return;
}

Assistant:

static void printLine(const wchar_t* text, const Args&... args)
	{
		std::wstring message = formatString(text,args...);
		printLine(message);
	}